

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O2

int Wlc_ManCountArithmReal(Wlc_Ntk_t *p,Vec_Int_t *vNodes)

{
  uint uVar1;
  Wlc_Obj_t *pWVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = 0;
  for (lVar5 = 0; lVar5 < vNodes->nSize; lVar5 = lVar5 + 1) {
    pWVar2 = Wlc_NtkObj(p,vNodes->pArray[lVar5]);
    uVar1 = *(ushort *)pWVar2 & 0x3f;
    if ((0x2d < uVar1) || (uVar3 = 1, (0x380000008000U >> uVar1 & 1) == 0)) {
      uVar3 = (uint)((short)uVar1 == 0x32);
    }
    iVar4 = iVar4 + uVar3;
  }
  return iVar4;
}

Assistant:

int Wlc_ManCountArithmReal( Wlc_Ntk_t * p, Vec_Int_t * vNodes )
{
    Wlc_Obj_t * pObj; 
    int i, Counter = 0;
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i )
        Counter += Wlc_ObjIsArithmReal( pObj );
    return Counter;
}